

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O1

REF_STATUS ref_phys_read_mapbc(REF_DICT ref_dict,char *mapbc_filename)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  FILE *__stream;
  char *pcVar4;
  undefined8 uVar5;
  REF_STATUS RVar6;
  REF_INT n;
  REF_INT type;
  REF_INT id;
  char buffer [1024];
  int local_444;
  REF_INT local_440;
  REF_INT local_43c;
  char local_438 [1032];
  
  __stream = fopen(mapbc_filename,"r");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",mapbc_filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x193,
           "ref_phys_read_mapbc","unable to open file");
    RVar6 = 2;
  }
  else {
    pcVar4 = fgets(local_438,0x400,__stream);
    if (local_438 == pcVar4) {
      iVar1 = __isoc99_sscanf(local_438,"%d",&local_444);
      if (iVar1 == 1) {
        if (0 < local_444) {
          iVar1 = 0;
          do {
            iVar2 = __isoc99_fscanf(__stream,"%d",&local_43c);
            if (iVar2 != 1) {
              pcVar4 = "read id";
              uVar5 = 0x198;
              goto LAB_001d1c26;
            }
            iVar2 = __isoc99_fscanf(__stream,"%d",&local_440);
            if (iVar2 != 1) {
              pcVar4 = "read type";
              uVar5 = 0x199;
              goto LAB_001d1c26;
            }
            fgets(local_438,0x400,__stream);
            uVar3 = ref_dict_store(ref_dict,local_43c,local_440);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x19b,"ref_phys_read_mapbc",(ulong)uVar3,"store");
              return uVar3;
            }
            iVar1 = iVar1 + 1;
          } while (iVar1 < local_444);
        }
        fclose(__stream);
        return 0;
      }
      pcVar4 = "unable to parse number of lines";
      uVar5 = 0x196;
    }
    else {
      pcVar4 = "unable to read number of lines";
      uVar5 = 0x195;
    }
LAB_001d1c26:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",uVar5,
           "ref_phys_read_mapbc",pcVar4);
    RVar6 = 1;
  }
  return RVar6;
}

Assistant:

REF_FCN REF_STATUS ref_phys_read_mapbc(REF_DICT ref_dict,
                                       const char *mapbc_filename) {
  FILE *file;
  REF_INT i, n, id, type;
  char buffer[1024];
  file = fopen(mapbc_filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", mapbc_filename);
  RNS(file, "unable to open file");
  RAS(buffer == fgets(buffer, sizeof(buffer), file),
      "unable to read number of lines");
  RES(1, sscanf(buffer, "%d", &n), "unable to parse number of lines");
  for (i = 0; i < n; i++) {
    RES(1, fscanf(file, "%d", &id), "read id");
    RES(1, fscanf(file, "%d", &type), "read type");
    fgets(buffer, sizeof(buffer), file);
    RSS(ref_dict_store(ref_dict, id, type), "store");
  }
  fclose(file);
  return REF_SUCCESS;
}